

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool CheckSignatureEncoding
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,uint flags,
               ScriptError *serror)

{
  long lVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar2;
  ScriptError SVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long in_FS_OFFSET;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSigCopy;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_current =
       (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  bVar5 = true;
  lVar6 = (long)(vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)__first._M_current;
  if (lVar6 == 0) goto LAB_0039288c;
  if (((flags & 0xe) == 0) || (bVar4 = IsValidSignatureEncoding(vchSig), bVar4)) {
    if ((flags & 8) == 0) {
LAB_00392808:
      if (((flags & 2) == 0) ||
         ((puVar2 = (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish,
          puVar2 != (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start &&
          ((byte)((puVar2[-1] & 0x7f) - 1) < 3)))) goto LAB_0039288c;
      if (serror == (ScriptError *)0x0) goto LAB_0039288a;
      SVar3 = SCRIPT_ERR_SIG_HASHTYPE;
      goto LAB_00392887;
    }
    bVar4 = IsValidSignatureEncoding(vchSig);
    if (!bVar4) goto LAB_00392880;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchSigCopy,__first,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current + lVar6 + -1),&local_51);
    bVar4 = CPubKey::CheckLowS(&vchSigCopy);
    if (serror != (ScriptError *)0x0 && !bVar4) {
      *serror = SCRIPT_ERR_SIG_HIGH_S;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vchSigCopy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (bVar4) goto LAB_00392808;
  }
  else {
LAB_00392880:
    if (serror != (ScriptError *)0x0) {
      SVar3 = SCRIPT_ERR_SIG_DER;
LAB_00392887:
      *serror = SVar3;
    }
  }
LAB_0039288a:
  bVar5 = false;
LAB_0039288c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CheckSignatureEncoding(const std::vector<unsigned char> &vchSig, unsigned int flags, ScriptError* serror) {
    // Empty signature. Not strictly DER encoded, but allowed to provide a
    // compact way to provide an invalid signature for use with CHECK(MULTI)SIG
    if (vchSig.size() == 0) {
        return true;
    }
    if ((flags & (SCRIPT_VERIFY_DERSIG | SCRIPT_VERIFY_LOW_S | SCRIPT_VERIFY_STRICTENC)) != 0 && !IsValidSignatureEncoding(vchSig)) {
        return set_error(serror, SCRIPT_ERR_SIG_DER);
    } else if ((flags & SCRIPT_VERIFY_LOW_S) != 0 && !IsLowDERSignature(vchSig, serror)) {
        // serror is set
        return false;
    } else if ((flags & SCRIPT_VERIFY_STRICTENC) != 0 && !IsDefinedHashtypeSignature(vchSig)) {
        return set_error(serror, SCRIPT_ERR_SIG_HASHTYPE);
    }
    return true;
}